

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  state s;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint16_t uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  uint local_3c;
  uint local_38;
  
  if (buflen == 0) {
    return 1;
  }
  u->field_set = 0;
  u->port = 0;
  s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
  lVar7 = 0;
  uVar10 = 7;
  local_3c = 0;
  local_38 = 0;
  do {
    if (buf + buflen <= buf + lVar7) {
      if (((ushort)local_3c & 3) != 1) {
        if ((local_3c & 2) != 0) {
          uVar6 = (ulong)u->field_data[1].off;
          uVar3 = u->field_data[1].len;
          u->field_data[1].len = 0;
          iVar9 = (uint)(local_38 == 0) * 2 + 2;
          lVar7 = uVar3 + uVar6;
          uVar8 = 0;
          for (; buf + uVar6 < buf + lVar7; uVar6 = uVar6 + 1) {
            bVar2 = buf[uVar6];
            if (bVar2 == 0x5b) {
              iVar9 = 5;
            }
            else {
              if ((0x19 < (byte)((bVar2 | 0x20) + 0x9f)) &&
                 (1 < (byte)(bVar2 - 0x2d) && 9 < (byte)(bVar2 - 0x30))) {
                return 1;
              }
              u->field_data[1].off = (uint16_t)uVar6;
              uVar8 = uVar8 + 1;
              u->field_data[1].len = uVar8;
              iVar9 = 6;
            }
          }
          if ((iVar9 - 2U < 10) && ((0x3afU >> (iVar9 - 2U & 0x1f) & 1) != 0)) {
            return 1;
          }
        }
        if (is_connect == 0) {
          if ((local_3c & 4) == 0) {
            return 0;
          }
        }
        else if ((ushort)local_3c != 6) {
          return 1;
        }
        pcVar11 = buf + u->field_data[2].off;
        pcVar4 = pcVar11 + u->field_data[2].len;
        uVar6 = 0;
        do {
          if (pcVar4 <= pcVar11) {
            u->port = (uint16_t)uVar6;
            return 0;
          }
          uVar6 = (uVar6 * 10 + (long)*pcVar11) - 0x30;
          pcVar11 = pcVar11 + 1;
        } while (uVar6 < 0x10000);
      }
      return 1;
    }
    s = parse_url_char(s,buf[lVar7]);
    switch(s) {
    case s_req_schema:
      uVar5 = 0;
      break;
    case s_req_schema_slash:
    case s_req_schema_slash_slash:
    case s_req_server_start:
    case s_req_query_string_start:
    case s_req_fragment_start:
      goto switchD_0015d26e_caseD_16;
    case s_req_server:
      uVar5 = 1;
      break;
    case s_req_server_with_at:
      uVar5 = 1;
      local_38 = uVar5;
      break;
    case s_req_path:
      uVar5 = 3;
      break;
    case s_req_query_string:
      uVar5 = 4;
      break;
    case s_req_fragment:
      uVar5 = 5;
      break;
    default:
      return 1;
    }
    if (uVar5 == uVar10) {
      puVar1 = &u->field_data[uVar10].len;
      *puVar1 = *puVar1 + 1;
    }
    else {
      u->field_data[uVar5].off = (uint16_t)lVar7;
      u->field_data[uVar5].len = 1;
      local_3c = local_3c | 1 << uVar5;
      u->field_set = (uint16_t)local_3c;
      uVar10 = uVar5;
    }
switchD_0015d26e_caseD_16:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}